

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::LoadUSDZFromMemory
               (uint8_t *addr,size_t length,string *filename,Stage *stage,string *warn,string *err,
               USDLoadOptions *options)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  pointer pUVar9;
  char *pcVar10;
  char cVar11;
  size_type sVar12;
  ulong uVar13;
  uint local_11c;
  string ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char *local_98;
  size_type local_90;
  char local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  assets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  assets.
  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  assets.
  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  assets.
  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = anon_unknown_27::ParseUSDZHeader(addr,length,&assets,err,warn);
  if (bVar2) {
    uVar13 = 0;
    bVar2 = false;
    local_11c = 0xffffffff;
    uVar8 = 0xffffffff;
    while( true ) {
      uVar6 = (ulong)local_11c;
      uVar7 = (uint)uVar8;
      if ((ulong)(((long)assets.
                         super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)assets.
                        super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x30) <= uVar13) break;
      pUVar9 = assets.
               super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar13;
      cVar11 = (char)pUVar9;
      lVar5 = ::std::__cxx11::string::rfind(cVar11,0x2e);
      if (lVar5 == -1) {
        ::std::__cxx11::string::string((string *)&local_98,"",(allocator *)&local_b8);
      }
      else {
        ::std::__cxx11::string::rfind(cVar11,0x2e);
        ::std::__cxx11::string::substr((ulong)&local_98,(ulong)pUVar9);
      }
      sVar1 = local_90;
      pcVar10 = local_98;
      for (sVar12 = 0; sVar1 != sVar12; sVar12 = sVar12 + 1) {
        iVar4 = tolower((uint)(byte)pcVar10[sVar12]);
        pcVar10[sVar12] = (char)iVar4;
      }
      ext._M_dataplus._M_p = (pointer)&ext.field_2;
      if (local_98 == &local_88) {
        ext.field_2._8_8_ = uStack_80;
      }
      else {
        ext._M_dataplus._M_p = local_98;
      }
      ext.field_2._M_allocated_capacity._1_7_ = uStack_87;
      ext.field_2._M_local_buf[0] = local_88;
      ext._M_string_length = local_90;
      local_90 = 0;
      local_88 = '\0';
      local_98 = &local_88;
      ::std::__cxx11::string::_M_dispose();
      iVar4 = ::std::__cxx11::string::compare((char *)&ext);
      if (iVar4 == 0) {
        bVar3 = bVar2;
        if (-1 < (int)uVar7) {
          if (!bVar2) {
            bVar3 = true;
          }
          if ((warn != (string *)0x0) && (!bVar2)) {
            ::std::operator+(&local_50,
                             "Multiple USDC files were found in USDZ. Use the first found one: ",
                             &assets.
                              super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar8].filename);
            ::std::operator+(&local_b8,&local_50,"]\n");
            ::std::__cxx11::string::append((string *)warn);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            bVar3 = true;
          }
        }
        bVar2 = bVar3;
        if (uVar7 == 0xffffffff) {
          uVar8 = uVar13 & 0xffffffff;
        }
      }
      else {
        iVar4 = ::std::__cxx11::string::compare((char *)&ext);
        if (iVar4 == 0) {
          bVar3 = bVar2;
          if (-1 < (int)local_11c) {
            if (!bVar2) {
              bVar3 = true;
            }
            if ((warn != (string *)0x0) && (!bVar2)) {
              ::std::operator+(&local_50,
                               "Multiple USDA files were found in USDZ. Use the first found one: ",
                               &assets.
                                super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar6].filename);
              ::std::operator+(&local_b8,&local_50,"]\n");
              ::std::__cxx11::string::append((string *)warn);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              bVar3 = true;
            }
          }
          bVar2 = bVar3;
          if (local_11c == 0xffffffff) {
            local_11c = (uint)uVar13;
          }
        }
      }
      ::std::__cxx11::string::_M_dispose();
      uVar13 = uVar13 + 1;
    }
    if ((uVar7 & local_11c) == 0xffffffff) {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::append((char *)err);
      }
    }
    else if (((warn == (string *)0x0) || ((int)uVar7 < 0)) || ((int)local_11c < 0)) {
      if (-1 < (int)uVar7) goto LAB_001194fb;
      bVar2 = true;
      if ((int)local_11c < 0) goto LAB_001196b5;
      uVar8 = assets.
              super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar6].byte_begin;
      uVar13 = assets.
               super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6].byte_end;
      if (uVar8 <= uVar13) {
        if (length < uVar8) {
          if (err != (string *)0x0) {
            pcVar10 = "Invalid start offset to USDA data: [";
            goto LAB_0011967b;
          }
        }
        else if (length < uVar13) {
          if (err != (string *)0x0) {
            pcVar10 = "Invalid end offset to USDA data: [";
            goto LAB_0011967b;
          }
        }
        else {
          bVar3 = LoadUSDAFromMemory(addr + uVar8,uVar13 - uVar8,filename,stage,warn,err,options);
          if (bVar3) goto LAB_001196b5;
          if (err != (string *)0x0) {
            pcVar10 = "Failed to load USDA: [";
            goto LAB_0011967b;
          }
        }
        goto LAB_001196b2;
      }
      if (err == (string *)0x0) goto LAB_001196b2;
      pcVar10 = "Invalid start/end offset to USDA data: [";
LAB_0011967b:
      ::std::operator+(&local_b8,pcVar10,filename);
      ::std::operator+(&ext,&local_b8,"].\n");
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ::std::operator+(&local_b8,"Both USDA and USDC file found. Use USDC file [",
                       &assets.
                        super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar8].filename);
      ::std::operator+(&ext,&local_b8,"]\n");
      ::std::__cxx11::string::append((string *)warn);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
LAB_001194fb:
      uVar13 = assets.
               super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].byte_begin;
      uVar8 = assets.
              super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar8].byte_end;
      if (uVar8 < uVar13) {
        if (err != (string *)0x0) {
          pcVar10 = "Invalid start/end offset to USDC data: [";
          goto LAB_0011967b;
        }
      }
      else if (length < uVar13) {
        if (err != (string *)0x0) {
          pcVar10 = "Invalid start offset to USDC data: [";
          goto LAB_0011967b;
        }
      }
      else if (length < uVar8) {
        if (err != (string *)0x0) {
          pcVar10 = "Invalid end offset to USDC data: [";
          goto LAB_0011967b;
        }
      }
      else {
        bVar3 = LoadUSDCFromMemory(addr + uVar13,uVar8 - uVar13,filename,stage,warn,err,options);
        bVar2 = true;
        if (bVar3) goto LAB_001196b5;
        if (err != (string *)0x0) {
          pcVar10 = "Failed to load USDC: [";
          goto LAB_0011967b;
        }
      }
    }
  }
LAB_001196b2:
  bVar2 = false;
LAB_001196b5:
  std::
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ::~vector(&assets);
  return bVar2;
}

Assistant:

bool LoadUSDZFromMemory(const uint8_t *addr, const size_t length,
                        const std::string &filename, Stage *stage,
                        std::string *warn, std::string *err,
                        const USDLoadOptions &options) {
  std::vector<USDZAssetInfo> assets;
  if (!ParseUSDZHeader(addr, length, &assets, warn, err)) {
    return false;
  }

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  for (size_t i = 0; i < assets.size(); i++) {
    DCOUT("[" << i << "] " << assets[i].filename << " : byte range ("
              << assets[i].byte_begin << ", " << assets[i].byte_end << ")");
  }
#endif

  int32_t usdc_index = -1;
  int32_t usda_index = -1;
  {
    bool warned = false;  // to report single warning message.
    for (size_t i = 0; i < assets.size(); i++) {
      std::string ext = str_tolower(GetFileExtension(assets[i].filename));
      if (ext.compare("usdc") == 0) {
        if ((usdc_index > -1) && (!warned)) {
          if (warn) {
            (*warn) +=
                "Multiple USDC files were found in USDZ. Use the first found "
                "one: " +
                assets[size_t(usdc_index)].filename + "]\n";
          }
          warned = true;
        }

        if (usdc_index == -1) {
          usdc_index = int32_t(i);
        }
      } else if (ext.compare("usda") == 0) {
        if ((usda_index > -1) && (!warned)) {
          if (warn) {
            (*warn) +=
                "Multiple USDA files were found in USDZ. Use the first found "
                "one: " +
                assets[size_t(usda_index)].filename + "]\n";
          }
          warned = true;
        }
        if (usda_index == -1) {
          usda_index = int32_t(i);
        }
      }
    }
  }

  if ((usdc_index == -1) && (usda_index == -1)) {
    if (err) {
      (*err) += "Neither USDC nor USDA file found in USDZ\n";
    }
    return false;
  }

  if ((usdc_index >= 0) && (usda_index >= 0)) {
    if (warn) {
      (*warn) += "Both USDA and USDC file found. Use USDC file [" +
                 assets[size_t(usdc_index)].filename + "]\n";
    }
  }

  if (usdc_index >= 0) {
    const size_t start_addr_offset = assets[size_t(usdc_index)].byte_begin;
    const size_t end_addr_offset = assets[size_t(usdc_index)].byte_end;
    if (end_addr_offset < start_addr_offset) {
      if (err) {
        (*err) +=
            "Invalid start/end offset to USDC data: [" + filename + "].\n";
      }
      return false;
    }
    const size_t usdc_size = end_addr_offset - start_addr_offset;

    if (start_addr_offset > length) {
      if (err) {
        (*err) += "Invalid start offset to USDC data: [" + filename + "].\n";
      }
      return false;
    }

    if (end_addr_offset > length) {
      if (err) {
        (*err) += "Invalid end offset to USDC data: [" + filename + "].\n";
      }
      return false;
    }

    const uint8_t *usdc_addr = addr + start_addr_offset;
    bool ret = LoadUSDCFromMemory(usdc_addr, usdc_size, filename, stage, warn,
                                  err, options);

    if (!ret) {
      if (err) {
        (*err) += "Failed to load USDC: [" + filename + "].\n";
      }

      return false;
    }
  } else if (usda_index >= 0) {
    const size_t start_addr_offset = assets[size_t(usda_index)].byte_begin;
    const size_t end_addr_offset = assets[size_t(usda_index)].byte_end;
    if (end_addr_offset < start_addr_offset) {
      if (err) {
        (*err) +=
            "Invalid start/end offset to USDA data: [" + filename + "].\n";
      }
      return false;
    }
    const size_t usda_size = end_addr_offset - start_addr_offset;

    if (start_addr_offset > length) {
      if (err) {
        (*err) += "Invalid start offset to USDA data: [" + filename + "].\n";
      }
      return false;
    }

    if (end_addr_offset > length) {
      if (err) {
        (*err) += "Invalid end offset to USDA data: [" + filename + "].\n";
      }
      return false;
    }

    const uint8_t *usda_addr = addr + start_addr_offset;
    bool ret = LoadUSDAFromMemory(usda_addr, usda_size, filename, stage, warn,
                                  err, options);

    if (!ret) {
      if (err) {
        (*err) += "Failed to load USDA: [" + filename + "].\n";
      }

      return false;
    }
  }

#if 0 // TODO: Remove
  // Decode images
  for (size_t i = 0; i < assets.size(); i++) {
    const std::string &uri = assets[i].filename;
    const std::string ext = GetFileExtension(uri);

    if ((ext.compare("png") == 0) || (ext.compare("jpg") == 0) ||
        (ext.compare("jpeg") == 0)) {
      const size_t start_addr_offset = assets[i].byte_begin;
      const size_t end_addr_offset = assets[i].byte_end;
      const size_t asset_size = end_addr_offset - start_addr_offset;
      const uint8_t *asset_addr = addr + start_addr_offset;

      if (end_addr_offset < start_addr_offset) {
        if (err) {
          (*err) += "Invalid start/end offset of asset #" + std::to_string(i) +
                    " in USDZ data: [" + filename + "].\n";
        }
        return false;
      }

      if (start_addr_offset > length) {
        if (err) {
          (*err) += "Invalid start offset of asset #" + std::to_string(i) +
                    " in USDZ data: [" + filename + "].\n";
        }
        return false;
      }

      if (end_addr_offset > length) {
        if (err) {
          (*err) += "Invalid end offset of asset #" + std::to_string(i) +
                    " in USDZ data: [" + filename + "].\n";
        }
        return false;
      }

      if (asset_size > (options.max_allowed_asset_size_in_mb * 1024ull * 1024ull)) {
        PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Asset no[{}] file size too large. {} bytes (max_allowed_asset_size {})",
          i, asset_size, options.max_allowed_asset_size_in_mb * 1024ull * 1024ull));
      }

      DCOUT("Image asset size: " << asset_size);

      {
        nonstd::expected<image::ImageInfoResult, std::string> info =
            image::GetImageInfoFromMemory(asset_addr, asset_size, uri);

        if (info) {
          if (info->width == 0) {
            PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Assset no[{}] Image has zero width.", i));
          }

          if (info->width > options.max_image_width) {
            PUSH_ERROR_AND_RETURN_TAG(
                kTagUSDZ, fmt::format("Asset no[{}] Image width too large. {} (max_image_width {})", i, info->width, options.max_image_width));
          }

          if (info->height == 0) {
            PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Asset no[{}] Image has zero height.", i));
          }

          if (info->height > options.max_image_height) {
            PUSH_ERROR_AND_RETURN_TAG(
                kTagUSDZ,
                fmt::format("Asset no[{}] Image height too large. {} (max_image_height {})", i, info->height, options.max_image_height));
          }

          if (info->channels == 0) {
            PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Asset no[{}] Image has zero channels.", i));
          }

          if (info->channels > options.max_image_channels) {
            PUSH_ERROR_AND_RETURN_TAG(
                kTagUSDZ,
                fmt::format("Asset no[{}] Image channels too much", i));
          }
        }
      }

      Image image;
      nonstd::expected<image::ImageResult, std::string> ret =
          image::LoadImageFromMemory(asset_addr, asset_size, uri);

      if (!ret) {
        (*err) += ret.error();
      } else {
        image = (*ret).image;
        if (!(*ret).warning.empty()) {
          (*warn) += (*ret).warning;
        }
      }
    } else {
      // TODO: Support other asserts(e.g. audio mp3)
    }
  }
#endif

  return true;
}